

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeSetMonitorFn(void *cvode_mem,CVMonitorFn fn)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    line = 0x61;
    cvode_mem = (CVodeMem)0x0;
  }
  else {
    msgfmt = "SUNDIALS was not built with monitoring enabled.";
    error_code = -0x16;
    line = 0x6d;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetMonitorFn",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSetMonitorFn(void* cvode_mem, CVMonitorFn fn)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

#ifdef SUNDIALS_BUILD_WITH_MONITORING
  cv_mem->cv_monitorfun = fn;
  return (CV_SUCCESS);
#else
  /* silence warnings when monitoring is disabled */
  ((void)fn);
  cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                 "SUNDIALS was not built with monitoring enabled.");
  return (CV_ILL_INPUT);
#endif
}